

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkPersistCall(CheckerVisitor *this,CallExpr *call)

{
  int iVar1;
  size_type_conflict sVar2;
  TreeOp TVar3;
  LiteralKind LVar4;
  SQChar *pSVar5;
  ArenaVector<SQCompilation::Expr_*> *this_00;
  Expr **ppEVar6;
  Id *this_01;
  Node *pNVar7;
  LiteralExpr *this_02;
  CallExpr *in_RSI;
  CheckerVisitor *in_RDI;
  pair<std::__detail::_Node_iterator<const_char_*,_true,_true>,_bool> pVar8;
  pair<std::__detail::_Node_iterator<const_char_*,_true,_true>,_bool> r;
  SQChar *key;
  LiteralExpr *l;
  Expr *evalKeyExpr;
  Expr *persistsFunc;
  Expr *keyExpr;
  ArenaVector<SQCompilation::Expr_*> *arguments;
  SQChar *calleeName;
  Expr *in_stack_ffffffffffffff88;
  char **in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  CheckerVisitor *in_stack_ffffffffffffffa8;
  Node *local_28;
  
  if ((in_RDI->effectsOnly & 1U) != 0) {
    return;
  }
  pSVar5 = extractFunctionName(in_stack_ffffffffffffffa8,
                               (CallExpr *)
                               CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0));
  if (pSVar5 == (SQChar *)0x0) {
    return;
  }
  this_00 = CallExpr::arguments(in_RSI);
  local_28 = (Node *)0x0;
  iVar1 = strcmp("persist",pSVar5);
  if (iVar1 == 0) {
    sVar2 = ArenaVector<SQCompilation::Expr_*>::size(this_00);
    if (sVar2 < 2) {
      return;
    }
    ppEVar6 = ArenaVector<SQCompilation::Expr_*>::operator[](this_00,0);
    local_28 = &(*ppEVar6)->super_Node;
  }
  else {
    iVar1 = strcmp("mkWatched",pSVar5);
    if (iVar1 == 0) {
      sVar2 = ArenaVector<SQCompilation::Expr_*>::size(this_00);
      if (sVar2 < 2) {
        return;
      }
      ArenaVector<SQCompilation::Expr_*>::operator[](this_00,0);
      pNVar7 = &maybeEval(in_RDI,in_stack_ffffffffffffff88,false)->super_Node;
      TVar3 = Node::op(pNVar7);
      if (TVar3 != TO_ID) {
        return;
      }
      this_01 = Node::asId(pNVar7);
      pSVar5 = Id::id(this_01);
      iVar1 = strcmp("persist",pSVar5);
      if (iVar1 != 0) {
        return;
      }
      ppEVar6 = ArenaVector<SQCompilation::Expr_*>::operator[](this_00,1);
      local_28 = &(*ppEVar6)->super_Node;
    }
  }
  if (local_28 != (Node *)0x0) {
    pNVar7 = &maybeEval(in_RDI,in_stack_ffffffffffffff88,false)->super_Node;
    TVar3 = Node::op(pNVar7);
    if (TVar3 == TO_LITERAL) {
      this_02 = Expr::asLiteral((Expr *)pNVar7);
      LVar4 = LiteralExpr::kind(this_02);
      if (LVar4 == LK_STRING) {
        pSVar5 = LiteralExpr::s(this_02);
        pVar8 = std::
                unordered_set<char_const*,SQCompilation::StringHasher,SQCompilation::StringEqualer,std::allocator<char_const*>>
                ::emplace<char_const*&>
                          ((unordered_set<const_char_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<const_char_*>_>
                            *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          report(in_RDI,local_28,0x81,pSVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkPersistCall(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *calleeName = extractFunctionName(call);

  if (!calleeName)
    return;

  const auto &arguments = call->arguments();
  const Expr *keyExpr = nullptr;

  if (strcmp("persist", calleeName) == 0) {
    if (arguments.size() < 2)
      return;
    keyExpr = arguments[0];
  }
  else if (strcmp("mkWatched", calleeName) == 0) {
    if (arguments.size() < 2)
      return;

    const Expr *persistsFunc = maybeEval(arguments[0]);
    if (persistsFunc->op() != TO_ID || strcmp("persist", persistsFunc->asId()->id()) != 0)
      return;

    keyExpr = arguments[1];
  }

  if (!keyExpr)
    return;

  const Expr *evalKeyExpr = maybeEval(keyExpr);

  if (evalKeyExpr->op() != TO_LITERAL)
    return;

  const LiteralExpr *l = evalKeyExpr->asLiteral();

  if (l->kind() != LK_STRING)
    return;

  const SQChar *key = l->s();

  auto r = persistedKeys.emplace(key);

  if (!r.second) {
    report(keyExpr, DiagnosticsId::DI_DUPLICATE_PERSIST_ID, key);
  }
}